

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_command.cpp
# Opt level: O1

SleepUnit duckdb::SleepCommand::ParseUnit(string *unit)

{
  int iVar1;
  runtime_error *this;
  SleepUnit SVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)unit);
  SVar2 = SECOND;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)unit);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)unit);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)unit);
        SVar2 = MILLISECOND;
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)unit);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)unit);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)unit);
              SVar2 = MICROSECOND;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)unit);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)unit);
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)unit);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)unit);
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)unit);
                        if (iVar1 != 0) {
                          this = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (this,
                                     "Unrecognized sleep mode - expected second/millisecond/microescond/nanosecond"
                                    );
                          __cxa_throw(this,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                      }
                    }
                    SVar2 = NANOSECOND;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return SVar2;
}

Assistant:

SleepUnit SleepCommand::ParseUnit(const string &unit) {
	if (unit == "second" || unit == "seconds" || unit == "sec") {
		return SleepUnit::SECOND;
	} else if (unit == "millisecond" || unit == "milliseconds" || unit == "milli") {
		return SleepUnit::MILLISECOND;
	} else if (unit == "microsecond" || unit == "microseconds" || unit == "micro") {
		return SleepUnit::MICROSECOND;
	} else if (unit == "nanosecond" || unit == "nanoseconds" || unit == "nano") {
		return SleepUnit::NANOSECOND;
	} else {
		throw std::runtime_error("Unrecognized sleep mode - expected second/millisecond/microescond/nanosecond");
	}
}